

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

Array<capnp::compiler::BrandedDecl> *
kj::heapArray<capnp::compiler::BrandedDecl>
          (Array<capnp::compiler::BrandedDecl> *__return_storage_ptr__,BrandedDecl *content,
          size_t size)

{
  BrandedDecl *pos;
  BrandedDecl *pBVar1;
  Array<capnp::compiler::BrandedDecl> *result;
  ArrayBuilder<capnp::compiler::BrandedDecl> local_48;
  
  pos = _::HeapArrayDisposer::allocateUninitialized<capnp::compiler::BrandedDecl>(size);
  local_48.endPtr = pos + size;
  local_48.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_48.ptr = pos;
  local_48.pos = pos;
  pBVar1 = _::
           CopyConstructArray_<capnp::compiler::BrandedDecl,_capnp::compiler::BrandedDecl_*,_false,_false>
           ::apply(pos,content,content + size);
  __return_storage_ptr__->ptr = pos;
  __return_storage_ptr__->size_ = ((long)pBVar1 - (long)pos) / 0xa8;
  __return_storage_ptr__->disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_48.ptr = (BrandedDecl *)0x0;
  local_48.pos = (RemoveConst<capnp::compiler::BrandedDecl> *)0x0;
  local_48.endPtr = (BrandedDecl *)0x0;
  ArrayBuilder<capnp::compiler::BrandedDecl>::dispose(&local_48);
  return __return_storage_ptr__;
}

Assistant:

Array<T> heapArray(T* content, size_t size) {
  ArrayBuilder<T> builder = heapArrayBuilder<T>(size);
  builder.addAll(content, content + size);
  return builder.finish();
}